

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

int32_t __thiscall google::protobuf::MapKey::GetInt32Value(MapKey *this)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  CVar1 = type(this);
  if (CVar1 != CPPTYPE_INT32) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0x84);
    pLVar2 = internal::LogMessage::operator<<(&local_50,"Protocol Buffer map usage error:\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"MapKey::GetInt32Value");
    pLVar2 = internal::LogMessage::operator<<(pLVar2," type does not match\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Expected : ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,(char *)0x3d7137);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Actual   : ");
    CVar1 = type(this);
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,*(char **)(FieldDescriptor::kCppTypeToName + (ulong)CVar1 * 8));
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return (this->val_).int32_value_;
}

Assistant:

int32_t GetInt32Value() const {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_INT32, "MapKey::GetInt32Value");
    return val_.int32_value_;
  }